

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uniforms.cpp
# Opt level: O0

void __thiscall
Uniforms::set(Uniforms *this,string *_name,vector<float,_std::allocator<float>_> *_data,bool _queue)

{
  value_type vVar1;
  size_type sVar2;
  int *piVar3;
  const_reference pvVar4;
  reference pvVar5;
  mapped_type *this_00;
  ulong local_48;
  size_t i;
  int local_38;
  undefined1 local_34 [4];
  int N;
  UniformValue value;
  bool _queue_local;
  vector<float,_std::allocator<float>_> *_data_local;
  string *_name_local;
  Uniforms *this_local;
  
  value._M_elems[2]._3_1_ = _queue;
  unique0x100000c2 = _data;
  sVar2 = std::vector<float,_std::allocator<float>_>::size(_data);
  i._4_4_ = (undefined4)sVar2;
  i._0_4_ = 4;
  piVar3 = std::min<int>((int *)((long)&i + 4),(int *)&i);
  local_38 = *piVar3;
  for (local_48 = 0; local_48 < (ulong)(long)local_38; local_48 = local_48 + 1) {
    pvVar4 = std::vector<float,_std::allocator<float>_>::operator[]
                       (stack0xffffffffffffffe0,local_48);
    vVar1 = *pvVar4;
    pvVar5 = std::array<float,_4UL>::operator[]((array<float,_4UL> *)local_34,local_48);
    *pvVar5 = vVar1;
  }
  this_00 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniformData,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniformData>_>_>
            ::operator[](&this->data,_name);
  UniformData::set(this_00,(UniformValue *)local_34,(long)local_38,false,
                   (bool)(value._M_elems[2]._3_1_ & 1));
  this->m_change = true;
  return;
}

Assistant:

void Uniforms::set( const std::string& _name, const std::vector<float>& _data, bool _queue) {
    UniformValue value;
    int N = std::min((int)_data.size(), 4);
    // memcpy(&value, _data.data(), N * sizeof(float) );
    for (size_t i = 0; i < N; i++)
        value[i] = _data[i];
    data[_name].set(value, N, false, _queue);
    m_change = true;
}